

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cc
# Opt level: O0

void __thiscall
avro::MapParser::MapParser
          (MapParser *this,ResolverFactory *factory,NodePtr *writer,NodePtr *reader,
          CompoundLayout *offsets)

{
  type pNVar1;
  shared_ptr<avro::Resolver> *this_00;
  _func_int **pp_Var2;
  Layout *this_01;
  size_t sVar3;
  shared_ptr<avro::Node> *in_RCX;
  shared_ptr<avro::Node> *in_RDX;
  Resolver *in_RDI;
  NodePtr *in_R8;
  size_t in_stack_ffffffffffffff68;
  CompoundLayout *in_stack_ffffffffffffff70;
  CompoundLayout *this_02;
  Resolver *in_stack_ffffffffffffff88;
  Layout *in_stack_ffffffffffffffc8;
  NodePtr *in_stack_ffffffffffffffd0;
  
  in_RDI->_vptr_Resolver = (_func_int **)0x0;
  Resolver::Resolver(in_RDI);
  in_RDI->_vptr_Resolver = (_func_int **)&PTR_parse_00311198;
  pNVar1 = boost::shared_ptr<avro::Node>::operator->(in_RDX);
  (*pNVar1->_vptr_Node[5])(pNVar1,1);
  pNVar1 = boost::shared_ptr<avro::Node>::operator->(in_RCX);
  (*pNVar1->_vptr_Node[5])(pNVar1,1);
  CompoundLayout::at(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_00 = (shared_ptr<avro::Resolver> *)
            ResolverFactory::construct
                      ((ResolverFactory *)in_RCX,in_R8,in_stack_ffffffffffffffd0,
                       in_stack_ffffffffffffffc8);
  boost::shared_ptr<avro::Resolver>::shared_ptr<avro::Resolver>(this_00,in_stack_ffffffffffffff88);
  pp_Var2 = (_func_int **)Layout::offset((Layout *)in_R8);
  in_RDI[3]._vptr_Resolver = pp_Var2;
  this_02 = (CompoundLayout *)(in_RDI + 4);
  this_01 = CompoundLayout::at(this_02,in_stack_ffffffffffffff68);
  sVar3 = Layout::offset(this_01);
  *(size_t *)this_02 = sVar3;
  return;
}

Assistant:

MapParser::MapParser(ResolverFactory &factory, const NodePtr &writer, const NodePtr &reader, const CompoundLayout &offsets) :
    Resolver(),
    resolver_(factory.construct(writer->leafAt(1), reader->leafAt(1), offsets.at(1))),
    offset_(offsets.offset()),
    setFuncOffset_( offsets.at(0).offset())
{ }